

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

SynchEvent * absl::EnsureSynchEvent(atomic<long> *addr,char *name,intptr_t bits,intptr_t lockbit)

{
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  SynchEvent *pSVar4;
  uint uVar5;
  ulong uVar6;
  char *__s;
  bool bVar7;
  
  if ((synch_event_mu & 1) == 0) {
    uVar5 = synch_event_mu | 1;
    LOCK();
    UNLOCK();
    uVar2 = synch_event_mu & 1;
    synch_event_mu = uVar5;
    if (uVar2 == 0) goto LAB_00142ac3;
  }
  base_internal::SpinLock::SlowLock((SpinLock *)&synch_event_mu);
LAB_00142ac3:
  uVar6 = (long)addr % 0x407 & 0xffffffff;
  for (pSVar4 = *(SynchEvent **)(synch_event + uVar6 * 8); pSVar4 != (SynchEvent *)0x0;
      pSVar4 = pSVar4->next) {
    if ((pSVar4->masked_addr ^ (ulong)addr) == 0xf03a5f7bf03a5f7b) {
      pSVar4->refcount = pSVar4->refcount + 1;
      goto LAB_00142b80;
    }
  }
  __s = "";
  if (name != (char *)0x0) {
    __s = name;
  }
  sVar3 = strlen(__s);
  pSVar4 = (SynchEvent *)base_internal::LowLevelAlloc::Alloc(sVar3 + 0x30);
  pSVar4->refcount = 2;
  pSVar4->masked_addr = (ulong)addr ^ 0xf03a5f7bf03a5f7b;
  pSVar4->invariant = (_func_void_void_ptr *)0x0;
  pSVar4->arg = (void *)0x0;
  pSVar4->log = false;
  strcpy(pSVar4->name,__s);
  pSVar4->next = *(SynchEvent **)(synch_event + uVar6 * 8);
  do {
    do {
      uVar1 = (addr->super___atomic_base<long>)._M_i;
      if ((bits & ~uVar1) == 0) goto LAB_00142b76;
    } while ((uVar1 & lockbit) != 0);
    LOCK();
    bVar7 = uVar1 == (addr->super___atomic_base<long>)._M_i;
    if (bVar7) {
      (addr->super___atomic_base<long>)._M_i = uVar1 | bits;
    }
    UNLOCK();
  } while (!bVar7);
LAB_00142b76:
  *(SynchEvent **)(synch_event + uVar6 * 8) = pSVar4;
LAB_00142b80:
  uVar2 = synch_event_mu;
  uVar5 = synch_event_mu & 2;
  LOCK();
  UNLOCK();
  bVar7 = 7 < synch_event_mu;
  synch_event_mu = uVar5;
  if (bVar7) {
    base_internal::SpinLock::SlowUnlock((SpinLock *)&synch_event_mu,uVar2);
  }
  return pSVar4;
}

Assistant:

static SynchEvent *EnsureSynchEvent(std::atomic<intptr_t> *addr,
                                    const char *name, intptr_t bits,
                                    intptr_t lockbit) {
  uint32_t h = reinterpret_cast<intptr_t>(addr) % kNSynchEvent;
  SynchEvent *e;
  // first look for existing SynchEvent struct..
  synch_event_mu.Lock();
  for (e = synch_event[h];
       e != nullptr && e->masked_addr != base_internal::HidePtr(addr);
       e = e->next) {
  }
  if (e == nullptr) {  // no SynchEvent struct found; make one.
    if (name == nullptr) {
      name = "";
    }
    size_t l = strlen(name);
    e = reinterpret_cast<SynchEvent *>(
        base_internal::LowLevelAlloc::Alloc(sizeof(*e) + l));
    e->refcount = 2;    // one for return value, one for linked list
    e->masked_addr = base_internal::HidePtr(addr);
    e->invariant = nullptr;
    e->arg = nullptr;
    e->log = false;
    strcpy(e->name, name);  // NOLINT(runtime/printf)
    e->next = synch_event[h];
    AtomicSetBits(addr, bits, lockbit);
    synch_event[h] = e;
  } else {
    e->refcount++;      // for return value
  }
  synch_event_mu.Unlock();
  return e;
}